

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionsTests.cpp
# Opt level: O2

void anon_unknown.dwarf_e9f1b::checkSameType(type_info *type1,type_info *type2,string *message)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  allocator<char> local_156;
  allocator<char> local_155;
  ExpressionDecomposer local_154;
  char *local_150;
  undefined8 local_148;
  char local_140 [8];
  undefined8 uStack_138;
  anon_union_24_2_13149d16_for_String_3 local_130;
  undefined8 uStack_118;
  Enum local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Result local_e8;
  ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_core_OptionsTests_cpp:18:9)>
  DOCTEST_CAPTURE_4;
  ResultBuilder DOCTEST_RB;
  
  doctest::detail::ContextScopeBase::ContextScopeBase(&DOCTEST_CAPTURE_4.super_ContextScopeBase);
  DOCTEST_CAPTURE_4.super_ContextScopeBase.super_IContextScope._vptr_IContextScope =
       (_func_int **)&PTR__ContextScope_001bb3f0;
  DOCTEST_CAPTURE_4.lambda_.message = message;
  doctest::String::String((String *)&local_130.data,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/core/OptionsTests.cpp"
             ,0x12,"std::string(type1.name()) == std::string(type2.name())","",
             (String *)&local_130.data);
  doctest::String::~String((String *)&local_130.data);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_154,DT_CHECK);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,*(char **)(type1 + 8) + (**(char **)(type1 + 8) == '*'),&local_155
            );
  local_130.data.ptr = local_130.buf + 0x10;
  if (local_150 == local_140) {
    uStack_118 = uStack_138;
  }
  else {
    local_130.data.ptr = local_150;
  }
  local_130._8_8_ = local_148;
  local_148 = 0;
  local_140[0] = '\0';
  local_110 = local_154.m_at;
  local_150 = local_140;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,*(char **)(type2 + 8) + (**(char **)(type2 + 8) == '*'),&local_156
            );
  doctest::detail::Expression_lhs<std::__cxx11::string>::operator==
            (&local_e8,(Expression_lhs<std::__cxx11::string> *)&local_130.data,&local_108);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
  doctest::String::~String(&local_e8.m_decomp);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_130.data);
  dVar2 = (double)std::__cxx11::string::~string((string *)&local_150);
  dVar2 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,dVar2);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  doctest::detail::
  ContextScope<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/core/OptionsTests.cpp:18:9)>
  ::~ContextScope(&DOCTEST_CAPTURE_4);
  return;
}

Assistant:

void checkSameType(std::type_info const& type1,
                       std::type_info const& type2,
                       const std::string& message)
    {
        CHECK_MESSAGE(std::string(type1.name()) == std::string(type2.name()), message);
    }